

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O1

idx_t __thiscall
duckdb::HivePartitionedColumnData::RegisterNewPartition
          (HivePartitionedColumnData *this,HivePartitionKey *key,
          PartitionedColumnDataAppendState *state)

{
  shared_ptr<duckdb::GlobalHivePartitionState,_true> *this_00;
  size_type sVar1;
  GlobalHivePartitionState *pGVar2;
  GlobalHivePartitionState *pGVar3;
  idx_t partition_id;
  pair<std::__detail::_Node_iterator<std::pair<const_duckdb::HivePartitionKey,_unsigned_long>,_false,_true>,_bool>
  pVar4;
  unique_lock<std::mutex> lck_gstate;
  unique_lock<std::mutex> local_80;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_70 [24];
  hash_t local_58;
  size_type local_50;
  HivePartitionKey local_48;
  
  if ((this->global_state).internal.
      super___shared_ptr<duckdb::GlobalHivePartitionState,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    partition_id = (this->local_partition_map)._M_h._M_element_count;
  }
  else {
    this_00 = &this->global_state;
    local_80._M_device =
         (mutex_type *)shared_ptr<duckdb::GlobalHivePartitionState,_true>::operator->(this_00);
    local_80._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_80);
    local_80._M_owns = true;
    pGVar2 = shared_ptr<duckdb::GlobalHivePartitionState,_true>::operator->(this_00);
    pGVar3 = shared_ptr<duckdb::GlobalHivePartitionState,_true>::operator->(this_00);
    sVar1 = (pGVar3->partition_map)._M_h._M_element_count;
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
              (local_70,(vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)key);
    local_58 = key->hash;
    local_50 = sVar1;
    pVar4 = ::std::
            _Hashtable<duckdb::HivePartitionKey,std::pair<duckdb::HivePartitionKey_const,unsigned_long>,std::allocator<std::pair<duckdb::HivePartitionKey_const,unsigned_long>>,std::__detail::_Select1st,duckdb::HivePartitionKey::Equality,duckdb::HivePartitionKey::Hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<duckdb::HivePartitionKey,unsigned_long>>
                      ((_Hashtable<duckdb::HivePartitionKey,std::pair<duckdb::HivePartitionKey_const,unsigned_long>,std::allocator<std::pair<duckdb::HivePartitionKey_const,unsigned_long>>,std::__detail::_Select1st,duckdb::HivePartitionKey::Equality,duckdb::HivePartitionKey::Hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&pGVar2->partition_map);
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(local_70);
    partition_id = *(idx_t *)((long)pVar4.first.
                                    super__Node_iterator_base<std::pair<const_duckdb::HivePartitionKey,_unsigned_long>,_true>
                                    ._M_cur.
                                    super__Node_iterator_base<std::pair<const_duckdb::HivePartitionKey,_unsigned_long>,_true>
                             + 0x28);
    ::std::unique_lock<std::mutex>::~unique_lock(&local_80);
  }
  local_48.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (key->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_48.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (key->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_48.values.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (key->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (key->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (key->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (key->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.hash = key->hash;
  AddNewPartition(this,&local_48,partition_id,state);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48);
  return partition_id;
}

Assistant:

idx_t HivePartitionedColumnData::RegisterNewPartition(HivePartitionKey key, PartitionedColumnDataAppendState &state) {
	idx_t partition_id;
	if (global_state) {
		// Synchronize Global state with our local state with the newly discovered partition
		unique_lock<mutex> lck_gstate(global_state->lock);

		// Insert into global map, or return partition if already present
		auto res = global_state->partition_map.emplace(std::make_pair(key, global_state->partition_map.size()));
		partition_id = res.first->second;
	} else {
		partition_id = local_partition_map.size();
	}
	AddNewPartition(std::move(key), partition_id, state);
	return partition_id;
}